

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O1

int comex_destroy_mutexes(void)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  
  if ((l_state.num_mutexes != 0) && (l_state.mutexes == (int *)0x0)) {
    __assert_fail("0 == l_state.num_mutexes || NULL != l_state.mutexes",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x7fb,"int comex_destroy_mutexes()");
  }
  comex_barrier(0);
  do {
    comex_make_progress();
    lVar1 = (long)l_state.num_mutexes;
    uVar2 = 0;
    if (0 < lVar1) {
      lVar3 = 0;
      do {
        uVar2 = uVar2 - (~l_state.mutexes[lVar3] >> 0x1f);
        lVar3 = lVar3 + 1;
      } while (lVar1 != lVar3);
      uVar2 = (uint)(uVar2 != 0);
    }
  } while ((l_state.lq_head != (comex_lock_t *)0x0) || ((char)uVar2 != '\0'));
  if (l_state.lq_tail == (comex_lock_t *)0x0) {
    if (0 < l_state.num_mutexes) {
      lVar3 = 0;
      do {
        if (-1 < l_state.mutexes[lVar3]) {
          __assert_fail("l_state.mutexes[i] < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                        ,0x813,"int comex_destroy_mutexes()");
        }
        lVar3 = lVar3 + 1;
      } while (lVar1 != lVar3);
    }
    l_state.num_mutexes = 0;
    free(l_state.mutexes);
    l_state.mutexes = (int *)0x0;
    return 0;
  }
  __assert_fail("NULL == l_state.lq_tail",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x80e,"int comex_destroy_mutexes()");
}

Assistant:

int comex_destroy_mutexes()
{
    int number_of_outstanding_locks = 0;

    /* make sure mutexes were previously created */
    assert(0 == l_state.num_mutexes || NULL != l_state.mutexes);

    /* fix race condition -- some procs reach destroy before servicing all
     * requests */
    comex_barrier(COMEX_GROUP_WORLD);

    /* you cannot free mutexes if one is in use or queued for use */
    do {
        int m;
        comex_make_progress();
        number_of_outstanding_locks = 0;
        for (m=0; m<l_state.num_mutexes; ++m) {
            if (l_state.mutexes[m] >= 0) {
                ++number_of_outstanding_locks;
            }
        }
    } while (l_state.lq_head || number_of_outstanding_locks > 0);

    assert(NULL == l_state.lq_head);
    assert(NULL == l_state.lq_tail);
#ifndef NDEBUG
    {
        int i;
        for (i=0; i<l_state.num_mutexes; ++i) {
            assert(l_state.mutexes[i] < 0);
        }
    }
#endif

    /* destroy mutex counts */
    l_state.num_mutexes = 0;

    /* destroy the mutexes */
    _my_free(l_state.mutexes);
    l_state.mutexes = NULL;

    return COMEX_SUCCESS;
}